

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void kj::_::Debug::
     log<char_const(&)[85],kj::_::DebugExpression<bool>&,char_const(&)[56],kj::Exception&>
               (char *file,char line [7],LogSeverity severity,char *macroArgs,char (*params) [85],
               DebugExpression<bool> *params_1,char (*params_2) [56],Exception_conflict *params_3)

{
  ArrayPtr<kj::String> argValues_00;
  undefined4 in_register_00000014;
  DebugExpression<bool> *params_00;
  char (*params_01) [56];
  Exception *params_02;
  long lVar1;
  String *in_stack_ffffffffffffff58;
  char argValues [4] [7];
  String local_68;
  String local_50;
  
  str<char_const(&)[85]>
            ((String *)argValues,(kj *)params,(char (*) [85])CONCAT44(in_register_00000014,severity)
            );
  str<kj::_::DebugExpression<bool>&>((String *)(argValues[3] + 3),(kj *)params_1,params_00);
  str<char_const(&)[56]>(&local_68,(kj *)params_2,params_01);
  str<kj::Exception&>(&local_50,(kj *)params_3,params_02);
  argValues_00.size_ = (size_t)macroArgs;
  argValues_00.ptr = in_stack_ffffffffffffff58;
  logInternal((Debug *)file,(char *)(ulong)line._0_4_,severity,(LogSeverity)macroArgs,argValues[0],
              argValues_00);
  lVar1 = 0x48;
  do {
    Array<char>::~Array((Array<char> *)(argValues[0] + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}